

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteRegistry::~ParameterizedTestSuiteRegistry
          (ParameterizedTestSuiteRegistry *this)

{
  pointer ppPVar1;
  TestSuiteInfoContainer *__range2;
  ParameterizedTestSuiteInfoBase **test_suite_info;
  pointer ppPVar2;
  
  ppPVar1 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar2 = (this->test_suite_infos_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppPVar2 != ppPVar1;
      ppPVar2 = ppPVar2 + 1) {
    if (*ppPVar2 != (ParameterizedTestSuiteInfoBase *)0x0) {
      (*(*ppPVar2)->_vptr_ParameterizedTestSuiteInfoBase[1])();
    }
  }
  ppPVar2 = (this->test_suite_infos_).
            super__Vector_base<testing::internal::ParameterizedTestSuiteInfoBase_*,_std::allocator<testing::internal::ParameterizedTestSuiteInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar2 != (pointer)0x0) {
    operator_delete(ppPVar2);
    return;
  }
  return;
}

Assistant:

~ParameterizedTestSuiteRegistry() {
    for (auto& test_suite_info : test_suite_infos_) {
      delete test_suite_info;
    }
  }